

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestresult.cpp
# Opt level: O3

void QTestResult::addFailure(char *message,char *file,int line)

{
  long lVar1;
  long lVar2;
  QTestEventLoop *pQVar3;
  long in_FS_OFFSET;
  void *local_48;
  char *pcStack_40;
  QMetaTypeInterface *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QTest::expectFailMode = 0;
  if (QTest::expectFailComment != (void *)0x0) {
    operator_delete__(QTest::expectFailComment);
  }
  QTest::expectFailComment = (void *)0x0;
  if (QCoreApplication::self != 0) {
    lVar1 = QThread::currentThread();
    lVar2 = QObject::thread();
    if (lVar1 == lVar2) {
      pQVar3 = QTestEventLoop::instance();
      lVar1 = QObject::thread();
      lVar2 = QThread::currentThread();
      if (lVar1 == lVar2) {
        QBasicTimer::stop();
        if (pQVar3->loop != (QEventLoop *)0x0) {
          QEventLoop::exit((int)pQVar3->loop);
        }
      }
      else {
        local_48 = (void *)0x0;
        pcStack_40 = (char *)0x0;
        local_38 = (QMetaTypeInterface *)0x0;
        QMetaObject::invokeMethodImpl
                  (&pQVar3->super_QObject,"exitLoop",QueuedConnection,1,&local_48,&pcStack_40,
                   &local_38);
      }
    }
  }
  if (QTest::blacklistCurrentTest == '\x01') {
    QTestLog::addBFail(message,file,line);
  }
  else {
    QTestLog::addFail(message,file,line);
  }
  QTest::setFailed(true);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTestResult::addFailure(const char *message, const char *file, int line)
{
    clearExpectFail();
    if (qApp && QThread::currentThread() == qApp->thread())
        QTestEventLoop::instance().exitLoop();

    if (QTest::blacklistCurrentTest)
        QTestLog::addBFail(message, file, line);
    else
        QTestLog::addFail(message, file, line);
    QTest::setFailed(true);
}